

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O2

void __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::CreateView
          (BufferBase<Diligent::EngineVkImplTraits> *this,BufferViewDesc *ViewDesc,
          IBufferView **ppView)

{
  BUFFER_VIEW_TYPE BVar1;
  char (*in_R8) [55];
  string msg;
  
  BVar1 = ViewDesc->ViewType;
  if (BVar1 == BUFFER_VIEW_UNDEFINED) {
    FormatString<char[34]>(&msg,(char (*) [34])"Buffer view type is not specified");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x7d);
    std::__cxx11::string::~string((string *)&msg);
    BVar1 = ViewDesc->ViewType;
  }
  if (BVar1 == BUFFER_VIEW_UNORDERED_ACCESS) {
    if (((this->
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         ).m_Desc.BindFlags & BIND_UNORDERED_ACCESS) != BIND_NONE) goto LAB_001a7b07;
    FormatString<char[38],char_const*,char[55]>
              (&msg,(Diligent *)"Attempting to create UAV for buffer \'",
               (char (*) [38])
               &(this->
                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                ).m_Desc,(char **)"\' that was not created with BIND_UNORDERED_ACCESS flag",in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x81);
  }
  else if (BVar1 == BUFFER_VIEW_SHADER_RESOURCE) {
    if (((this->
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         ).m_Desc.BindFlags & BIND_SHADER_RESOURCE) != BIND_NONE) goto LAB_001a7b07;
    FormatString<char[38],char_const*,char[54]>
              (&msg,(Diligent *)"Attempting to create SRV for buffer \'",
               (char (*) [38])
               &(this->
                super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                ).m_Desc,(char **)"\' that was not created with BIND_SHADER_RESOURCE flag",
               (char (*) [54])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x7f);
  }
  else {
    FormatString<char[28]>(&msg,(char (*) [28])"Unexpected buffer view type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x83);
  }
  std::__cxx11::string::~string((string *)&msg);
LAB_001a7b07:
  (**(code **)((long)(this->
                     super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                     ).super_ObjectBase<Diligent::IBufferVk>.
                     super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.super_IBuffer.
                     super_IDeviceObject.super_IObject + 0xb8))(this,ViewDesc,ppView,0);
  return;
}

Assistant:

CreateView(const struct BufferViewDesc& ViewDesc, IBufferView** ppView) override
    {
        DEV_CHECK_ERR(ViewDesc.ViewType != BUFFER_VIEW_UNDEFINED, "Buffer view type is not specified");
        if (ViewDesc.ViewType == BUFFER_VIEW_SHADER_RESOURCE)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_SHADER_RESOURCE, "Attempting to create SRV for buffer '", this->m_Desc.Name, "' that was not created with BIND_SHADER_RESOURCE flag");
        else if (ViewDesc.ViewType == BUFFER_VIEW_UNORDERED_ACCESS)
            DEV_CHECK_ERR(this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS, "Attempting to create UAV for buffer '", this->m_Desc.Name, "' that was not created with BIND_UNORDERED_ACCESS flag");
        else
            UNEXPECTED("Unexpected buffer view type");

        CreateViewInternal(ViewDesc, ppView, false);
    }